

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_exporter.cpp
# Opt level: O2

void __thiscall Assimp::JSONWriter::StartArray(JSONWriter *this,bool is_element)

{
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,is_element) != 0) {
    AddIndentation(this);
    if (this->first == false) {
      std::operator<<((ostream *)&this->field_0x58,',');
    }
  }
  this->first = true;
  std::operator<<((ostream *)&this->field_0x58,"[\n");
  PushIndent(this);
  return;
}

Assistant:

void StartArray(bool is_element = false) {
        // if this appears as a plain array element, we need to insert a delimiter and we should also indent it
        if (is_element) {
            AddIndentation();
            if (!first) {
                buff << ',';
            }
        }
        first = true;
        buff << "[\n";
        PushIndent();
    }